

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UBool utext_equals_63(UText *a,UText *b)

{
  int64_t iVar1;
  long lVar2;
  bool bVar3;
  
  if ((b != (UText *)0x0 && a != (UText *)0x0) && (a->magic == 0x345ad82c)) {
    if (((b->magic == 0x345ad82c) && (a->pFuncs == b->pFuncs)) && (a->context == b->context)) {
      if (a->nativeIndexingLimit < a->chunkOffset) {
        iVar1 = (*a->pFuncs->mapOffsetToNative)(a);
      }
      else {
        iVar1 = (long)a->chunkOffset + a->chunkNativeStart;
      }
      if (b->nativeIndexingLimit < b->chunkOffset) {
        lVar2 = (*b->pFuncs->mapOffsetToNative)(b);
      }
      else {
        lVar2 = (long)b->chunkOffset + b->chunkNativeStart;
      }
      bVar3 = iVar1 == lVar2;
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
utext_equals(const UText *a, const UText *b) {
    if (a==NULL || b==NULL ||
        a->magic != UTEXT_MAGIC ||
        b->magic != UTEXT_MAGIC) {
            // Null or invalid arguments don't compare equal to anything.
            return FALSE;
    }

    if (a->pFuncs != b->pFuncs) {
        // Different types of text providers.
        return FALSE;
    }

    if (a->context != b->context) {
        // Different sources (different strings)
        return FALSE;
    }
    if (utext_getNativeIndex(a) != utext_getNativeIndex(b)) {
        // Different current position in the string.
        return FALSE;
    }

    return TRUE;
}